

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aio.c
# Opt level: O0

nni_aio_expire_q * nni_aio_expire_q_alloc(void)

{
  int iVar1;
  nni_aio_expire_q *eq;
  
  eq = (nni_aio_expire_q *)nni_zalloc(0x120);
  if (eq == (nni_aio_expire_q *)0x0) {
    eq = (nni_aio_expire_q *)0x0;
  }
  else {
    nni_mtx_init((nni_mtx *)eq);
    nni_cv_init(&eq->eq_cv,(nni_mtx *)eq);
    nni_list_init_offset(&eq->eq_list,0x1b0);
    eq->eq_next = 0xffffffffffffffff;
    eq->eq_exit = false;
    iVar1 = nni_thr_init(&eq->eq_thr,nni_aio_expire_loop,eq);
    if (iVar1 == 0) {
      nni_thr_run(&eq->eq_thr);
    }
    else {
      nni_aio_expire_q_free(eq);
      eq = (nni_aio_expire_q *)0x0;
    }
  }
  return eq;
}

Assistant:

static nni_aio_expire_q *
nni_aio_expire_q_alloc(void)
{
	nni_aio_expire_q *eq;

	if ((eq = NNI_ALLOC_STRUCT(eq)) == NULL) {
		return (NULL);
	}
	nni_mtx_init(&eq->eq_mtx);
	nni_cv_init(&eq->eq_cv, &eq->eq_mtx);
	NNI_LIST_INIT(&eq->eq_list, nni_aio, a_expire_node);
	eq->eq_next = NNI_TIME_NEVER;
	eq->eq_exit = false;

	if (nni_thr_init(&eq->eq_thr, nni_aio_expire_loop, eq) != 0) {
		nni_aio_expire_q_free(eq);
		return (NULL);
	}

	nni_thr_run(&eq->eq_thr);
	return (eq);
}